

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_segwit_tests.cpp
# Opt level: O1

void __thiscall
script_segwit_tests::IsPayToWitnessScriptHash_Valid::test_method
          (IsPayToWitnessScriptHash_Valid *this)

{
  readonly_property65 rVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  const_string file;
  initializer_list<unsigned_char> __l;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  CScript p2wsh;
  uint256 dummy;
  check_type cVar4;
  char *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  assertion_result local_138;
  char **local_120;
  assertion_result local_118;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e0;
  char *local_c8;
  char *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  char *local_a8;
  char *local_a0;
  undefined1 local_98 [24];
  undefined8 local_80;
  undefined1 local_78 [28];
  uint uStack_5c;
  uchar local_58 [40];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_58[0x10] = '\0';
  local_58[0x11] = '\0';
  local_58[0x12] = '\0';
  local_58[0x13] = '\0';
  local_58[0x14] = '\0';
  local_58[0x15] = '\0';
  local_58[0x16] = '\0';
  local_58[0x17] = '\0';
  local_58[0x18] = '\0';
  local_58[0x19] = '\0';
  local_58[0x1a] = '\0';
  local_58[0x1b] = '\0';
  local_58[0x1c] = '\0';
  local_58[0x1d] = '\0';
  local_58[0x1e] = '\0';
  local_58[0x1f] = '\0';
  local_78._16_8_ = 0;
  stack0xffffffffffffffa0 = 0;
  local_78._0_8_ = (char *)0x0;
  local_78._8_8_ = 0;
  local_58[0] = '\0';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\0';
  local_58[0xb] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  local_98._0_8_ = local_98._0_8_ & 0xffffffffffffff00;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_78,(iterator)local_78,
             local_98);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_98,local_58,
             local_58 + 0x20,(allocator_type *)&local_138);
  CScript::operator<<((CScript *)local_78,
                      (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98);
  if ((_func_int **)local_98._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_98._0_8_,local_98._16_8_ - local_98._0_8_);
  }
  local_a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_segwit_tests.cpp"
  ;
  local_a0 = "";
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x11;
  file.m_begin = (iterator)&local_a8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_b8,msg);
  rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)CScript::IsPayToWitnessScriptHash((CScript *)local_78);
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar1.super_readonly_property<bool>.super_class_property<bool>.value;
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_80 = &local_e0;
  local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "p2wsh.IsPayToWitnessScriptHash()";
  local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  local_98[8] = false;
  local_98._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_98._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_segwit_tests.cpp"
  ;
  local_c0 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)local_98,1,0,WARN,_cVar4,(size_t)&local_c8,0x11);
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  local_98._0_2_ = 0x2000;
  __l._M_len = 2;
  __l._M_array = local_98;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_e0,__l,(allocator_type *)&local_138);
  local_98._0_8_ = local_98._0_8_ & 0xffffffffffffff00;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_insert
            (&local_e0,
             (iterator)
             local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,0x20,local_98);
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_segwit_tests.cpp"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x15;
  file_00.m_begin = (iterator)&local_f0;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_100,
             msg_00);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::
  prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_98,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish);
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)CScript::IsPayToWitnessScriptHash((CScript *)local_98);
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_120 = &local_148;
  local_148 = "CScript(bytes.begin(), bytes.end()).IsPayToWitnessScriptHash()";
  local_140 = "";
  local_138.m_message.px = (element_type *)((ulong)local_138.m_message.px & 0xffffffffffffff00);
  local_138._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_segwit_tests.cpp"
  ;
  local_150 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_118,(lazy_ostream *)&local_138,1,0,WARN,_cVar4,(size_t)&local_158,0x15);
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  if (0x1c < local_80._4_4_) {
    free((void *)local_98._0_8_);
    local_98._0_8_ = (_func_int **)0x0;
  }
  if (local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (0x1c < uStack_5c) {
    free((void *)local_78._0_8_);
    local_78._0_8_ = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(IsPayToWitnessScriptHash_Valid)
{
    uint256 dummy;
    CScript p2wsh;
    p2wsh << OP_0 << ToByteVector(dummy);
    BOOST_CHECK(p2wsh.IsPayToWitnessScriptHash());

    std::vector<unsigned char> bytes = {OP_0, 32};
    bytes.insert(bytes.end(), 32, 0);
    BOOST_CHECK(CScript(bytes.begin(), bytes.end()).IsPayToWitnessScriptHash());
}